

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmGlobalGenerator::GetDirectoryContent(cmGlobalGenerator *this,string *dir,bool needDisk)

{
  bool bVar1;
  mapped_type *pmVar2;
  unsigned_long uVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  unsigned_long dindex;
  Directory d;
  allocator local_61;
  Directory local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::DirectoryContent>_>_>
           ::operator[](&this->DirectoryContentMap,dir);
  if ((int)CONCAT71(in_register_00000011,needDisk) != 0) {
    local_58 = cmsys::SystemTools::ModifiedTime(dir);
    if (local_58 != pmVar2->LastDiskTime) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(pmVar2->All)._M_t,&(pmVar2->Generated)._M_t);
      cmsys::Directory::Directory(&local_60);
      bVar1 = cmsys::Directory::Load(&local_60,dir);
      if (bVar1) {
        uVar3 = cmsys::Directory::GetNumberOfFiles(&local_60);
        for (dindex = 0; uVar3 != dindex; dindex = dindex + 1) {
          pcVar4 = cmsys::Directory::GetFile(&local_60,dindex);
          if ((*pcVar4 != '.') ||
             ((pcVar4[1] != '\0' && ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))))) {
            std::__cxx11::string::string((string *)&local_50,pcVar4,&local_61);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&pmVar2->All,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      pmVar2->LastDiskTime = local_58;
      cmsys::Directory::~Directory(&local_60);
    }
  }
  return &pmVar2->All;
}

Assistant:

std::set<std::string> const&
cmGlobalGenerator::GetDirectoryContent(std::string const& dir, bool needDisk)
{
  DirectoryContent& dc = this->DirectoryContentMap[dir];
  if(needDisk)
    {
    long mt = cmSystemTools::ModifiedTime(dir);
    if (mt != dc.LastDiskTime)
      {
      // Reset to non-loaded directory content.
      dc.All = dc.Generated;

      // Load the directory content from disk.
      cmsys::Directory d;
      if(d.Load(dir))
        {
        unsigned long n = d.GetNumberOfFiles();
        for(unsigned long i = 0; i < n; ++i)
          {
          const char* f = d.GetFile(i);
          if(strcmp(f, ".") != 0 && strcmp(f, "..") != 0)
            {
            dc.All.insert(f);
            }
          }
        }
      dc.LastDiskTime = mt;
      }
    }
  return dc.All;
}